

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_fader_process_pcm_frames
                    (ma_fader *pFader,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  ma_format format;
  long lVar5;
  ma_uint32 channels;
  ma_uint64 mVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ma_uint64 frameCount_00;
  ulong uVar10;
  
  if (pFader == (ma_fader *)0x0) {
    return MA_INVALID_ARGS;
  }
  uVar3 = pFader->cursorInFrames;
  frameCount_00 = 0xffffffff - uVar3;
  if (uVar3 + frameCount >> 0x20 == 0) {
    frameCount_00 = frameCount;
  }
  fVar1 = pFader->volumeBeg;
  fVar2 = pFader->volumeEnd;
  if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
    uVar4 = pFader->lengthInFrames;
    format = (pFader->config).format;
    if (uVar3 < uVar4) {
      if (format != ma_format_f32) {
        return MA_NOT_IMPLEMENTED;
      }
      lVar5 = 0;
      for (mVar6 = 0; mVar6 != frameCount_00; mVar6 = mVar6 + 1) {
        uVar7 = mVar6 + uVar3;
        if (uVar4 <= mVar6 + uVar3) {
          uVar7 = uVar4;
        }
        fVar1 = pFader->volumeBeg;
        fVar2 = pFader->volumeEnd;
        uVar8 = (ulong)(pFader->config).channels;
        lVar9 = lVar5 * uVar8;
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          *(float *)((long)pFramesOut + uVar10 * 4 + lVar9) =
               *(float *)((long)pFramesIn + uVar10 * 4 + lVar9) *
               ((fVar2 - fVar1) * ((float)(uVar7 & 0xffffffff) / (float)(uVar4 & 0xffffffff)) +
               fVar1);
        }
        lVar5 = lVar5 + 4;
      }
      goto LAB_0019055f;
    }
    channels = (pFader->config).channels;
  }
  else {
    format = (pFader->config).format;
    channels = (pFader->config).channels;
    if ((fVar1 == 1.0) && (!NAN(fVar1))) {
      ma_copy_pcm_frames(pFramesOut,pFramesIn,frameCount_00,format,channels);
      goto LAB_0019055f;
    }
  }
  ma_copy_and_apply_volume_and_clip_pcm_frames
            (pFramesOut,pFramesIn,frameCount_00,format,channels,fVar2);
LAB_0019055f:
  pFader->cursorInFrames = pFader->cursorInFrames + frameCount_00;
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_fader_process_pcm_frames(ma_fader* pFader, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    if (pFader == NULL) {
        return MA_INVALID_ARGS;
    }

    /*
    For now we need to clamp frameCount so that the cursor never overflows 32-bits. This is required for
    the conversion to a float which we use for the linear interpolation. This might be changed later.
    */
    if (frameCount + pFader->cursorInFrames > UINT_MAX) {
        frameCount = UINT_MAX - pFader->cursorInFrames;
    }

    /* Optimized path if volumeBeg and volumeEnd are equal. */
    if (pFader->volumeBeg == pFader->volumeEnd) {
        if (pFader->volumeBeg == 1) {
            /* Straight copy. */
            ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, pFader->config.format, pFader->config.channels);
        } else {
            /* Copy with volume. */
            ma_copy_and_apply_volume_and_clip_pcm_frames(pFramesOut, pFramesIn, frameCount, pFader->config.format, pFader->config.channels, pFader->volumeEnd);
        }
    } else {
        /* Slower path. Volumes are different, so may need to do an interpolation. */
        if (pFader->cursorInFrames >= pFader->lengthInFrames) {
            /* Fast path. We've gone past the end of the fade period so just apply the end volume to all samples. */
            ma_copy_and_apply_volume_and_clip_pcm_frames(pFramesOut, pFramesIn, frameCount, pFader->config.format, pFader->config.channels, pFader->volumeEnd);
        } else {
            /* Slow path. This is where we do the actual fading. */
            ma_uint64 iFrame;
            ma_uint32 iChannel;

            /* For now we only support f32. Support for other formats will be added later. */
            if (pFader->config.format == ma_format_f32) {
                const float* pFramesInF32  = (const float*)pFramesIn;
                /* */ float* pFramesOutF32 = (      float*)pFramesOut;

                for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                    float a = (ma_uint32)ma_min(pFader->cursorInFrames + iFrame, pFader->lengthInFrames) / (float)((ma_uint32)pFader->lengthInFrames);   /* Safe cast due to the frameCount clamp at the top of this function. */
                    float volume = ma_mix_f32_fast(pFader->volumeBeg, pFader->volumeEnd, a);

                    for (iChannel = 0; iChannel < pFader->config.channels; iChannel += 1) {
                        pFramesOutF32[iFrame*pFader->config.channels + iChannel] = pFramesInF32[iFrame*pFader->config.channels + iChannel] * volume;
                    }
                }
            } else {
                return MA_NOT_IMPLEMENTED;
            }
        }
    }

    pFader->cursorInFrames += frameCount;

    return MA_SUCCESS;
}